

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O3

QUrl QUrl::fromEncoded(QByteArrayView input,ParsingMode mode)

{
  storage_type *in_RCX;
  undefined4 in_register_00000014;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_38;
  long local_20;
  
  ba.m_size._4_4_ = in_register_00000014;
  ba.m_size._0_4_ = mode;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  ba.m_data = in_RCX;
  QString::fromUtf8(&local_38,(QString *)input.m_data,ba);
  QUrl((QUrl *)input.m_size,&local_38,(ParsingMode)in_RCX);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QUrl)(QUrlPrivate *)input.m_size;
  }
  __stack_chk_fail();
}

Assistant:

QUrl QUrl::fromEncoded(QByteArrayView input, ParsingMode mode)
{
    return QUrl(QString::fromUtf8(input), mode);
}